

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

bool __thiscall QUrl::isValid(QUrl *this)

{
  byte bVar1;
  QUrlPrivate *pQVar2;
  Error *pEVar3;
  long lVar4;
  char16_t *pcVar5;
  bool bVar6;
  ErrorCode EVar7;
  long lVar8;
  
  pQVar2 = this->d;
  if ((pQVar2 == (QUrlPrivate *)0x0) ||
     (((pQVar2->sectionIsPresent == '\0' && (pQVar2->port == -1)) && ((pQVar2->path).d.size == 0))))
  {
    return false;
  }
  pEVar3 = (pQVar2->error)._M_t.
           super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
           super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
           super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  if (pEVar3 == (Error *)0x0) {
    lVar4 = (pQVar2->path).d.size;
    EVar7 = NoError;
    if (lVar4 != 0) {
      pcVar5 = (pQVar2->path).d.ptr;
      bVar1 = pQVar2->sectionIsPresent;
      if (*pcVar5 == L'/') {
        if (((lVar4 != 1) && (EVar7 = NoError, (bVar1 & 0x1e) == 0)) &&
           (EVar7 = AuthorityAbsentAndPathIsDoubleSlash, pcVar5[1] != L'/')) {
          EVar7 = NoError;
        }
      }
      else {
        EVar7 = AuthorityPresentAndPathIsRelative;
        if (((bVar1 & 8) == 0) && (EVar7 = NoError, (bVar1 & 1) == 0)) {
          lVar8 = 0;
          do {
            if (pcVar5[lVar8] == L'/') {
              bVar6 = false;
              this = (QUrl *)0x0;
            }
            else if (pcVar5[lVar8] == L':') {
              this = (QUrl *)0x13f00;
              bVar6 = false;
            }
            else {
              bVar6 = true;
            }
            if (!bVar6) {
              EVar7 = (ErrorCode)this;
              break;
            }
            lVar8 = lVar8 + 1;
            EVar7 = NoError;
          } while (lVar4 != lVar8);
        }
      }
    }
  }
  else {
    EVar7 = pEVar3->code;
  }
  return EVar7 == NoError;
}

Assistant:

bool QUrl::isEmpty() const
{
    if (!d) return true;
    return d->isEmpty();
}